

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * decDecap(decNumber *dn,int32_t drop)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  ulong uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint8_t *uar;
  
  uar = dn->lsu;
  uVar1 = dn->digits - drop;
  if (uVar1 == 0 || dn->digits < drop) {
    *uar = '\0';
    iVar3 = 1;
  }
  else {
    if ((int)uVar1 < 0x32) {
      uVar4 = (ulong)""[(int)uVar1];
      uVar5 = (uint)""[(int)uVar1];
    }
    else {
      uVar4 = (ulong)uVar1;
      uVar5 = uVar1;
    }
    puVar6 = uar + (uVar4 - 1);
    iVar2 = (uVar1 - uVar5) + 1;
    if (iVar2 != 1) {
      *puVar6 = (byte)((uint)*puVar6 % DECPOWERS[iVar2]);
    }
    iVar3 = decGetDigits(uar,((int)puVar6 - (int)uar) + 1);
  }
  dn->digits = iVar3;
  return dn;
}

Assistant:

static decNumber *decDecap(decNumber *dn, Int drop) {
  Unit *msu;                            /* -> target cut point  */
  Int cut;                              /* work  */
  if (drop>=dn->digits) {               /* losing the whole thing  */
    #if DECCHECK
    if (drop>dn->digits)
      printf("decDecap called with drop>digits [%ld>%ld]\n",
             (LI)drop, (LI)dn->digits);
    #endif
    dn->lsu[0]=0;
    dn->digits=1;
    return dn;
    }
  msu=dn->lsu+D2U(dn->digits-drop)-1;   /* -> likely msu  */
  cut=MSUDIGITS(dn->digits-drop);       /* digits to be in use in msu  */
  if (cut!=DECDPUN) *msu%=powers[cut];  /* clear left digits  */
  /* that may have left leading zero digits, so do a proper count...  */
  dn->digits=decGetDigits(dn->lsu, static_cast<int32_t>(msu-dn->lsu+1));
  return dn;
  }